

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall rw::Frame::destroy(Frame *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  Frame *pFVar3;
  Frame **ppFVar4;
  LLLink *pLVar5;
  
  pLVar5 = (this->objectList).link.next;
  while (pLVar5 != &(this->objectList).link) {
    pLVar1 = pLVar5->next;
    if (pLVar5[-1].prev != (LLLink *)0x0) {
      pLVar2 = pLVar5->prev;
      pLVar2->next = pLVar1;
      pLVar1->prev = pLVar2;
    }
    pLVar5[-1].prev = (LLLink *)0x0;
    pLVar5 = pLVar1;
  }
  PluginList::destruct((PluginList *)&s_plglist,this);
  if ((this->object).parent != (void *)0x0) {
    removeChild(this);
  }
  if (((this->object).privateFlags & 3) != 0) {
    pLVar5 = (this->inDirtyList).next;
    pLVar1 = (this->inDirtyList).prev;
    pLVar1->next = pLVar5;
    pLVar5->prev = pLVar1;
  }
  ppFVar4 = &this->child;
  while (pFVar3 = *ppFVar4, pFVar3 != (Frame *)0x0) {
    (pFVar3->object).parent = (void *)0x0;
    ppFVar4 = &pFVar3->next;
  }
  (*DAT_00145dd0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Frame::destroy(void)
{
	FORLIST(lnk, this->objectList)
		ObjectWithFrame::fromFrame(lnk)->setFrame(nil);
	s_plglist.destruct(this);
	if(this->getParent())
		this->removeChild();
	if(this->object.privateFlags & Frame::HIERARCHYSYNC)
		this->inDirtyList.remove();
	for(Frame *f = this->child; f; f = f->next)
		f->object.parent = nil;
	rwFree(this);
	numAllocated--;
}